

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void ym2608_reset_chip(void *chip)

{
  FM_OPN *OPN;
  double dVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  OPN = (FM_OPN *)((long)chip + 0x208);
  *(undefined1 *)((long)chip + 0x235) = 2;
  OPNSetPres(OPN,0x90,0x90,8);
  *(undefined8 *)((long)chip + 0x5388) = *(undefined8 *)((long)chip + 0x220);
  (**(code **)((long)chip + 0x670))(*(undefined8 *)((long)chip + 0x678));
  *(byte *)((long)chip + 0x208) = *(byte *)((long)chip + 0x208) & 0xfb;
  *(undefined1 *)((long)chip + 0x540a) = 0x1f;
  bVar3 = *(byte *)((long)chip + 0x5409) & 0x1f;
  *(byte *)((long)chip + 0x22e) = bVar3;
  bVar2 = *(byte *)((long)chip + 0x22f);
  if (*(char *)((long)chip + 0x22d) == '\0') {
    if ((bVar2 & bVar3) != 0) {
      *(undefined1 *)((long)chip + 0x22d) = 1;
      if (*(code **)((long)chip + 0x650) != (code *)0x0) {
        (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210));
        bVar2 = *(byte *)((long)chip + 0x22f);
        if (*(char *)((long)chip + 0x22d) == '\0') goto LAB_00130e3c;
        bVar3 = *(byte *)((long)chip + 0x22e);
      }
      goto LAB_00130d67;
    }
LAB_00130e3c:
    *(undefined1 *)((long)chip + 0x5409) = 0xe3;
    bVar3 = *(byte *)((long)chip + 0x540a) & 0xe3;
    *(byte *)((long)chip + 0x22e) = bVar3;
LAB_00130e52:
    if ((bVar3 & bVar2) == 0) goto LAB_00130e95;
    *(undefined1 *)((long)chip + 0x22d) = 1;
    if (*(code **)((long)chip + 0x650) != (code *)0x0) {
      (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210));
      if (*(char *)((long)chip + 0x22d) == '\0') goto LAB_00130e95;
      bVar3 = *(byte *)((long)chip + 0x22e);
      bVar2 = *(byte *)((long)chip + 0x22f);
    }
  }
  else {
LAB_00130d67:
    if ((bVar2 & bVar3) == 0) {
      *(undefined1 *)((long)chip + 0x22d) = 0;
      if (*(code **)((long)chip + 0x650) == (code *)0x0) goto LAB_00130e3c;
      (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210));
      bVar2 = *(byte *)((long)chip + 0x22f);
      bVar3 = *(byte *)((long)chip + 0x540a) & 0xe3;
      *(undefined1 *)((long)chip + 0x5409) = 0xe3;
      *(byte *)((long)chip + 0x22e) = bVar3;
      if (*(char *)((long)chip + 0x22d) != '\0') goto LAB_00130d85;
      goto LAB_00130e52;
    }
    *(undefined1 *)((long)chip + 0x5409) = 0xe3;
    bVar3 = *(byte *)((long)chip + 0x540a) & 0xe3;
    *(byte *)((long)chip + 0x22e) = bVar3;
  }
LAB_00130d85:
  if ((bVar2 & bVar3) == 0) {
    *(undefined1 *)((long)chip + 0x22d) = 0;
    if (*(code **)((long)chip + 0x650) != (code *)0x0) {
      (**(code **)((long)chip + 0x650))(((FM_ST *)((long)chip + 0x210))->param);
    }
  }
LAB_00130e95:
  *(undefined8 *)((long)chip + 0x6d8) = 0;
  *(undefined4 *)((long)chip + 0x23c) = 0;
  *(undefined4 *)((long)chip + 0x244) = 0;
  *(undefined1 *)((long)chip + 0x69c) = 0;
  *(undefined1 *)((long)chip + 0x22f) = 0;
  *(undefined4 *)((long)chip + 0x230) = 0;
  *(undefined1 *)((long)chip + 0x22d) = 0;
  memset((void *)((long)chip + 8),0,0x200);
  reset_channels((FM_ST *)((long)chip + 0x210),(FM_CH *)((long)chip + 0x4778),6);
  uVar4 = 0xb7;
  do {
    uVar4 = uVar4 - 1;
    OPNWriteReg(OPN,uVar4,0xc0);
    OPNWriteReg(OPN,uVar4 | 0x100,0xc0);
  } while (0xb4 < uVar4);
  uVar4 = 0xb3;
  do {
    uVar4 = uVar4 - 1;
    OPNWriteReg(OPN,uVar4,0);
    OPNWriteReg(OPN,uVar4 | 0x100,0);
  } while (0x30 < uVar4);
  uVar4 = 0x27;
  OPNWriteMode(OPN,0x27,0x30);
  do {
    uVar4 = uVar4 - 1;
    OPNWriteReg(OPN,uVar4,0);
  } while (0x20 < uVar4);
  dVar1 = *(double *)((long)chip + 0x220);
  lVar5 = 0;
  uVar6 = 0;
  do {
    *(int *)((long)chip + lVar5 * 8 + 0x512c) =
         (int)(long)((double)((float)dVar1 * 65536.0) /
                    *(double *)(&DAT_0017b860 + (ulong)(uVar6 < 4) * 8));
    *(undefined8 *)((long)chip + lVar5 * 8 + 0x5130) =
         *(undefined8 *)((long)YM2608_ADPCM_ROM_addr + lVar5);
    *(undefined8 *)((long)chip + lVar5 * 8 + 0x5124) = 0;
    *(undefined1 *)((long)chip + lVar5 * 8 + 0x5148) = 0;
    *(long *)((long)chip + lVar5 * 8 + 0x5150) = (long)chip + 0x4738;
    *(undefined2 *)((long)chip + lVar5 * 8 + 0x5120) = 0;
    *(undefined8 *)((long)chip + lVar5 * 8 + 0x513c) = 0;
    *(undefined4 *)((long)chip + lVar5 * 8 + 0x5144) = 0;
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 8;
  } while (uVar6 != 6);
  *(undefined1 *)((long)chip + 0x511c) = 0x3f;
  *(undefined1 *)((long)chip + 0x5360) = 0;
  *(double *)((long)chip + 0x5388) = dVar1;
  YM_DELTAT_ADPCM_Reset((YM_DELTAT *)((long)chip + 0x5368),3);
  return;
}

Assistant:

void ym2608_reset_chip(void *chip)
{
	int i;
	YM2608 *F2608 = (YM2608 *)chip;
	FM_OPN *OPN   = &F2608->OPN;
	YM_DELTAT *DELTAT = &F2608->deltaT;

	/* Reset Prescaler */
	OPNPrescaler_w(OPN , 0 , 2);
	F2608->deltaT.freqbase = OPN->ST.freqbase;
	/* reset SSG section */
	OPN->ST.SSG_funcs.reset(OPN->ST.SSG_param);

	/* status clear */
	FM_BUSY_CLEAR(&OPN->ST);

	/* register 0x29 - default value after reset is:
		enable only 3 FM channels and enable all the status flags */
	YM2608IRQMaskWrite(OPN, F2608, 0x1f );  /* default value for D4-D0 is 1 */

	/* register 0x10, A1=1 - default value is 1 for D4, D3, D2, 0 for the rest */
	YM2608IRQFlagWrite(OPN, F2608, 0x1c );  /* default: enable timer A and B, disable EOS, BRDY and ZERO */

	OPN->eg_timer = 0;
	OPN->eg_cnt   = 0;

	OPN->ST.TAC    = 0;
	OPN->ST.TBC    = 0;

	OPN->SL3.key_csm = 0;

	OPN->ST.status = 0;
	OPN->ST.mode = 0;
	OPN->ST.irq = 0;

	memset(F2608->REGS, 0x00, sizeof(UINT8) * 512);

	reset_channels( &OPN->ST , F2608->CH , 6 );
	/* reset Operator paramater */
	for(i = 0xb6 ; i >= 0xb4 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0xc0);
		OPNWriteReg(OPN,i|0x100,0xc0);
	}
	for(i = 0xb2 ; i >= 0x30 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0);
		OPNWriteReg(OPN,i|0x100,0);
	}
	OPNWriteMode(OPN,0x27,0x30); /* mode 0 , timer reset */
	for(i = 0x26 ; i >= 0x20 ; i-- ) OPNWriteReg(OPN,i,0);

	/* ADPCM - percussion sounds */
	for( i = 0; i < 6; i++ )
	{
		if (i<=3)   /* channels 0,1,2,3 */
			F2608->adpcm[i].step      = (UINT32)((float)(1<<ADPCM_SHIFT)*((float)F2608->OPN.ST.freqbase)/3.0);
		else        /* channels 4 and 5 work with slower clock */
			F2608->adpcm[i].step      = (UINT32)((float)(1<<ADPCM_SHIFT)*((float)F2608->OPN.ST.freqbase)/6.0);

		F2608->adpcm[i].start     = YM2608_ADPCM_ROM_addr[i*2];
		F2608->adpcm[i].end       = YM2608_ADPCM_ROM_addr[i*2+1];

		F2608->adpcm[i].now_addr  = 0;
		F2608->adpcm[i].now_step  = 0;
		// F2608->adpcm[i].delta     = 21866;
		F2608->adpcm[i].vol_mul   = 0;
		F2608->adpcm[i].pan       = &OPN->out_adpcm[OUTD_CENTER]; /* default center */
		F2608->adpcm[i].flagMask  = 0;
		F2608->adpcm[i].flag      = 0;
		F2608->adpcm[i].adpcm_acc = 0;
		F2608->adpcm[i].adpcm_step= 0;
		F2608->adpcm[i].adpcm_out = 0;
	}
	F2608->adpcmTL = 0x3f;

	F2608->adpcm_arrivedEndAddress = 0; /* not used */

	/* DELTA-T unit */
	DELTAT->freqbase = OPN->ST.freqbase;
	YM_DELTAT_ADPCM_Reset(DELTAT,OUTD_CENTER);
}